

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.h
# Opt level: O2

void __thiscall Blob_Detection::BlobParameters::_verify(BlobParameters *this)

{
  size_t in_RCX;
  uchar *in_RDX;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  uchar *sig_02;
  uchar *sig_03;
  EVP_PKEY_CTX *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  
  Parameter<double>::verify(&this->circularity,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  Parameter<double>::verify(&this->elongation,in_RSI,sig,in_RCX,in_R8,in_R9);
  Parameter<unsigned_int>::verify(&this->height,in_RSI,sig_00,in_RCX,in_R8,in_R9);
  Parameter<double>::verify(&this->length,in_RSI,sig_01,in_RCX,in_R8,in_R9);
  Parameter<unsigned_int>::verify(&this->size,in_RSI,sig_02,in_RCX,in_R8,in_R9);
  Parameter<unsigned_int>::verify(&this->width,in_RSI,sig_03,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void _verify()
        {
            circularity.verify();
            elongation.verify();
            height.verify();
            length.verify();
            size.verify();
            width.verify();
        }